

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.cc
# Opt level: O2

void __thiscall avro::GenericRecord::GenericRecord(GenericRecord *this,NodePtr *schema)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  size_t i;
  ulong uVar3;
  GenericDatum local_40;
  
  GenericContainer::GenericContainer(&this->super_GenericContainer,AVRO_RECORD,schema);
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = (*schema->px->_vptr_Node[4])();
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::resize
            (&this->fields_,CONCAT44(extraout_var,iVar1));
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*schema->px->_vptr_Node[4])();
    if (CONCAT44(extraout_var_00,iVar1) <= uVar3) break;
    iVar1 = (*schema->px->_vptr_Node[5])(schema->px,uVar3 & 0xffffffff);
    GenericDatum::GenericDatum(&local_40,(NodePtr *)CONCAT44(extraout_var_01,iVar1));
    GenericDatum::operator=
              ((GenericDatum *)
               ((long)&((this->fields_).
                        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
                        _M_impl.super__Vector_impl_data._M_start)->type_ + lVar2),&local_40);
    if (local_40.value_.content != (placeholder *)0x0) {
      (*(local_40.value_.content)->_vptr_placeholder[1])();
    }
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

GenericRecord::GenericRecord(const NodePtr& schema) :
    GenericContainer(AVRO_RECORD, schema) {
    fields_.resize(schema->leaves());
    for (size_t i = 0; i < schema->leaves(); ++i) {
        fields_[i] = GenericDatum(schema->leafAt(i));
    }
}